

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFilter_defaultAbsoluteMismatches_Test::testBody
          (TEST_TestFilter_defaultAbsoluteMismatches_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_40;
  TestFilter filter;
  
  TestFilter::TestFilter(&filter,"filtername");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"notevenclose");
  bVar1 = TestFilter::match(&filter,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!filter.match(\"notevenclose\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
             ,0x2e,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"filterrname");
  bVar1 = TestFilter::match(&filter,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!filter.match(\"filterrname\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
             ,0x2f,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"");
  bVar1 = TestFilter::match(&filter,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!filter.match(\"\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
             ,0x30,pTVar3);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&filter.filter_);
  return;
}

Assistant:

TEST(TestFilter, defaultAbsoluteMismatches)
{
    TestFilter filter("filtername");
    CHECK(!filter.match("notevenclose"));
    CHECK(!filter.match("filterrname"));
    CHECK(!filter.match(""));
}